

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTF.cpp
# Opt level: O1

ConversionResult
llvm::ConvertUTF16toUTF32
          (UTF16 **sourceStart,UTF16 *sourceEnd,UTF32 **targetStart,UTF32 *targetEnd,
          ConversionFlags flags)

{
  bool bVar1;
  ConversionResult CVar2;
  ushort *puVar3;
  UTF32 *pUVar4;
  ushort *puVar5;
  UTF32 UVar6;
  
  puVar5 = *sourceStart;
  pUVar4 = *targetStart;
  CVar2 = conversionOK;
  do {
    if (sourceEnd <= puVar5) break;
    puVar3 = puVar5 + 1;
    UVar6 = (UTF32)*puVar5;
    if ((UVar6 & 0xfc00) == 0xd800) {
      if (puVar3 < sourceEnd) {
        if ((*puVar3 & 0xfc00) == 0xdc00) {
          UVar6 = UVar6 * 0x400 + (uint)*puVar3 + 0xfca02400;
          puVar3 = puVar5 + 2;
        }
        else if (flags == strictConversion) {
          CVar2 = sourceIllegal;
          goto LAB_0019116a;
        }
LAB_00191151:
        if (pUVar4 < targetEnd) {
          *pUVar4 = UVar6;
          pUVar4 = pUVar4 + 1;
          bVar1 = true;
          puVar5 = puVar3;
          goto LAB_0019116d;
        }
        CVar2 = targetExhausted;
      }
      else {
        CVar2 = sourceExhausted;
      }
LAB_0019116a:
      bVar1 = false;
    }
    else {
      if ((flags != strictConversion) || ((UVar6 & 0xfc00) != 0xdc00)) goto LAB_00191151;
      bVar1 = false;
      CVar2 = sourceIllegal;
    }
LAB_0019116d:
  } while (bVar1);
  *sourceStart = puVar5;
  *targetStart = pUVar4;
  return CVar2;
}

Assistant:

ConversionResult ConvertUTF16toUTF32 (
        const UTF16** sourceStart, const UTF16* sourceEnd,
        UTF32** targetStart, UTF32* targetEnd, ConversionFlags flags) {
    ConversionResult result = conversionOK;
    const UTF16* source = *sourceStart;
    UTF32* target = *targetStart;
    UTF32 ch, ch2;
    while (source < sourceEnd) {
        const UTF16* oldSource = source; /*  In case we have to back up because of target overflow. */
        ch = *source++;
        /* If we have a surrogate pair, convert to UTF32 first. */
        if (ch >= UNI_SUR_HIGH_START && ch <= UNI_SUR_HIGH_END) {
            /* If the 16 bits following the high surrogate are in the source buffer... */
            if (source < sourceEnd) {
                ch2 = *source;
                /* If it's a low surrogate, convert to UTF32. */
                if (ch2 >= UNI_SUR_LOW_START && ch2 <= UNI_SUR_LOW_END) {
                    ch = ((ch - UNI_SUR_HIGH_START) << halfShift)
                        + (ch2 - UNI_SUR_LOW_START) + halfBase;
                    ++source;
                } else if (flags == strictConversion) { /* it's an unpaired high surrogate */
                    --source; /* return to the illegal value itself */
                    result = sourceIllegal;
                    break;
                }
            } else { /* We don't have the 16 bits following the high surrogate. */
                --source; /* return to the high surrogate */
                result = sourceExhausted;
                break;
            }
        } else if (flags == strictConversion) {
            /* UTF-16 surrogate values are illegal in UTF-32 */
            if (ch >= UNI_SUR_LOW_START && ch <= UNI_SUR_LOW_END) {
                --source; /* return to the illegal value itself */
                result = sourceIllegal;
                break;
            }
        }
        if (target >= targetEnd) {
            source = oldSource; /* Back up source pointer! */
            result = targetExhausted; break;
        }
        *target++ = ch;
    }
    *sourceStart = source;
    *targetStart = target;
#ifdef CVTUTF_DEBUG
if (result == sourceIllegal) {
    fprintf(stderr, "ConvertUTF16toUTF32 illegal seq 0x%04x,%04x\n", ch, ch2);
    fflush(stderr);
}
#endif
    return result;
}